

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::cone(Mesh *__return_storage_ptr__,float radius,float _height,int _radiusSegments,
                 int _heightSegments,int _capSegments,DrawMode _drawMode)

{
  double dVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  vec<3,_float,_(glm::qualifier)0> vVar7;
  int local_188;
  int local_184;
  int x_3;
  int y_3;
  int x_2;
  int y_2;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  int local_158;
  int local_154;
  int ix_1;
  int iy_1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_148;
  float local_144;
  int local_140;
  float maxTexYNormalized;
  int x_1;
  int y_1;
  int x;
  int y;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_128;
  vec3 local_120;
  vec2 local_110;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_108;
  vec2 local_100;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_f8;
  vec<3,_float,_(glm::qualifier)0> local_f0;
  undefined1 local_e0 [8];
  vec3 crossed;
  undefined1 local_c0 [8];
  vec3 diff;
  float local_ac;
  float local_a8;
  float local_a4;
  int local_a0;
  int local_9c;
  int ix;
  int iy;
  vec3 startVec;
  float maxTexY;
  size_t vertOffset;
  vec3 up;
  vec2 tcoord;
  vec3 normal;
  vec3 vert;
  float newRad;
  float halfH;
  float heightInc;
  float angleIncRadius;
  int capSegs;
  DrawMode local_28;
  DrawMode _drawMode_local;
  int _capSegments_local;
  int _heightSegments_local;
  int _radiusSegments_local;
  float _height_local;
  float radius_local;
  Mesh *mesh;
  
  _radiusSegments_local = (int)radius;
  __height_local = __return_storage_ptr__;
  Mesh::Mesh(__return_storage_ptr__);
  local_28 = _drawMode;
  if ((_drawMode != TRIANGLE_STRIP) && (_drawMode != TRIANGLES)) {
    local_28 = TRIANGLE_STRIP;
  }
  Mesh::setDrawMode(__return_storage_ptr__,local_28);
  iVar3 = _radiusSegments + 1;
  heightInc = (float)(_capSegments + 1);
  _drawMode_local = _heightSegments + LINES;
  if ((int)_drawMode_local < 2) {
    _drawMode_local = LINE_STRIP;
  }
  if ((int)heightInc < 2) {
    heightInc = 0.0;
  }
  fVar2 = -6.2831855 / ((float)iVar3 - 1.0);
  fVar4 = _height / ((float)(int)_drawMode_local - 1.0);
  aVar5.z = _height * 0.5;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)((long)&vertOffset + 4),0.0,1.0,0.0);
  stack0xffffffffffffff78 = 0;
  startVec.field_1.y = (float)(int)_drawMode_local - 1.0;
  if (0 < (int)heightInc) {
    startVec.field_1.y = ((float)(int)heightInc - 1.0) + startVec.field_1.y;
  }
  glm::vec<3,float,(glm::qualifier)0>::vec<int,float,int>
            ((vec<3,float,(glm::qualifier)0> *)&ix,0,-1.0 - aVar5.z,0);
  for (local_9c = 0; local_9c < (int)_drawMode_local; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < iVar3; local_a0 = local_a0 + 1) {
      local_a4 = (float)local_9c;
      local_a8 = 0.0;
      local_ac = (float)(int)(_drawMode_local - LINES);
      diff.field_2.z = 0.0;
      fVar6 = remap(&local_a4,&local_a8,&local_ac,&diff.field_2.z,(float *)&_radiusSegments_local,
                    true);
      dVar1 = std::cos((double)(ulong)(uint)((float)local_a0 * fVar2));
      normal.field_1.y = SUB84(dVar1,0) * fVar6;
      normal.field_2.z = fVar4 * (float)local_9c - aVar5.z;
      std::sin((double)(ulong)(uint)((float)local_a0 * fVar2));
      up.field_1.y = (float)local_a0 / ((float)iVar3 - 1.0);
      up.field_2.z = 1.0 - (float)local_9c / startVec.field_1.y;
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&up.field_1);
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      if (local_9c == 0) {
        dVar1 = std::cos((double)CONCAT44(extraout_XMM0_Db,(float)local_a0 * fVar2));
        normal.field_1.y = SUB84(dVar1,0) * 1.0;
        normal.field_2.z = fVar4 * (float)local_9c - aVar5.z;
        std::sin((double)(ulong)(uint)((float)local_a0 * fVar2));
      }
      vVar7 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)&normal.field_1,
                             (vec<3,_float,_(glm::qualifier)0> *)&ix);
      diff.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar7.field_2;
      unique0x100001d2 = vVar7._0_8_;
      local_c0 = (undefined1  [8])unique0x100001d2;
      vVar7 = glm::cross<float,(glm::qualifier)0>
                        ((vec<3,_float,_(glm::qualifier)0> *)((long)&vertOffset + 4),
                         (vec<3,_float,_(glm::qualifier)0> *)&normal.field_1);
      local_f0.field_2 = vVar7.field_2;
      local_f0._0_8_ = vVar7._0_8_;
      local_e0 = (undefined1  [8])local_f0._0_8_;
      crossed.field_0.x = local_f0.field_2.z;
      vVar7 = glm::cross<float,(glm::qualifier)0>
                        ((vec<3,_float,_(glm::qualifier)0> *)local_e0,
                         (vec<3,_float,_(glm::qualifier)0> *)local_c0);
      local_108 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar7.field_2;
      local_110 = vVar7._0_8_;
      local_100 = local_110;
      local_f8 = local_108;
      tcoord = local_110;
      normal.field_0 = local_108;
      vVar7 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)&tcoord)
      ;
      local_128 = vVar7.field_2;
      _x = vVar7._0_8_;
      local_120._0_8_ = _x;
      local_120.field_2 = local_128;
      Mesh::addNormal(__return_storage_ptr__,&local_120);
    }
  }
  if (local_28 == TRIANGLES) {
    for (y_1 = 0; y_1 < (int)(_drawMode_local - LINES); y_1 = y_1 + 1) {
      for (x_1 = 0; x_1 < _radiusSegments; x_1 = x_1 + 1) {
        if (0 < y_1) {
          Mesh::addIndex(__return_storage_ptr__,y_1 * iVar3 + x_1);
          Mesh::addIndex(__return_storage_ptr__,y_1 * iVar3 + 1 + x_1);
          Mesh::addIndex(__return_storage_ptr__,(y_1 + 1) * iVar3 + x_1);
        }
        Mesh::addIndex(__return_storage_ptr__,y_1 * iVar3 + 1 + x_1);
        Mesh::addIndex(__return_storage_ptr__,(y_1 + 1) * iVar3 + 1 + x_1);
        Mesh::addIndex(__return_storage_ptr__,(y_1 + 1) * iVar3 + x_1);
      }
    }
  }
  else {
    for (maxTexYNormalized = 0.0; (int)maxTexYNormalized < (int)(_drawMode_local - LINES);
        maxTexYNormalized = (float)((int)maxTexYNormalized + 1)) {
      for (local_140 = 0; local_140 < iVar3; local_140 = local_140 + 1) {
        Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized * iVar3 + local_140);
        Mesh::addIndex(__return_storage_ptr__,((int)maxTexYNormalized + 1) * iVar3 + local_140);
      }
    }
  }
  register0x00000000 = Mesh::getVerticesTotal(__return_storage_ptr__);
  local_144 = ((float)(int)_drawMode_local - 1.0) / startVec.field_1.y;
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix_1,0.0,1.0,0.0);
  tcoord = _ix_1;
  normal.field_0 = local_148;
  for (local_154 = 0; local_154 < (int)heightInc; local_154 = local_154 + 1) {
    for (local_158 = 0; local_158 < iVar3; local_158 = local_158 + 1) {
      local_15c = (float)local_154;
      local_160 = 0.0;
      local_164 = (float)((int)heightInc + -1);
      local_168 = 0.0;
      fVar4 = remap(&local_15c,&local_160,&local_164,(float *)&_radiusSegments_local,&local_168,true
                   );
      dVar1 = std::cos((double)(ulong)(uint)((float)local_158 * fVar2));
      normal.field_1.y = SUB84(dVar1,0) * fVar4;
      std::sin((double)(ulong)(uint)((float)local_158 * fVar2));
      up.field_1.y = (float)local_158 / ((float)iVar3 + -1.0);
      local_16c = (float)local_154;
      local_170 = 0.0;
      y_2 = (int)(float)((int)heightInc + -1);
      x_2 = 0x3f800000;
      normal.field_2.z = aVar5.z;
      fVar4 = remap(&local_16c,&local_170,(float *)&y_2,&local_144,(float *)&x_2,true);
      up.field_2.z = 1.0 - fVar4;
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&up.field_1);
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&tcoord);
    }
  }
  if (local_28 == TRIANGLES) {
    if (0 < (int)heightInc) {
      for (y_3 = 0; y_3 < (int)heightInc + -1; y_3 = y_3 + 1) {
        for (x_3 = 0; x_3 < _radiusSegments; x_3 = x_3 + 1) {
          Mesh::addIndex(__return_storage_ptr__,y_3 * iVar3 + x_3 + (int)startVec.field_2);
          Mesh::addIndex(__return_storage_ptr__,(int)startVec.field_2 + 1 + y_3 * iVar3 + x_3);
          Mesh::addIndex(__return_storage_ptr__,(y_3 + 1) * iVar3 + x_3 + (int)startVec.field_2);
          if (y_3 < (int)heightInc + -2) {
            Mesh::addIndex(__return_storage_ptr__,(int)startVec.field_2 + 1 + y_3 * iVar3 + x_3);
            Mesh::addIndex(__return_storage_ptr__,
                           (int)startVec.field_2 + 1 + (y_3 + 1) * iVar3 + x_3);
            Mesh::addIndex(__return_storage_ptr__,(y_3 + 1) * iVar3 + x_3 + (int)startVec.field_2);
          }
        }
      }
    }
  }
  else if (0 < (int)heightInc) {
    for (local_184 = 0; local_184 < (int)heightInc + -1; local_184 = local_184 + 1) {
      for (local_188 = 0; local_188 < iVar3; local_188 = local_188 + 1) {
        Mesh::addIndex(__return_storage_ptr__,local_184 * iVar3 + local_188 + (int)startVec.field_2)
        ;
        Mesh::addIndex(__return_storage_ptr__,
                       (local_184 + 1) * iVar3 + local_188 + (int)startVec.field_2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh cone( float radius, float _height, int _radiusSegments, int _heightSegments, int _capSegments, DrawMode _drawMode ) {
    Mesh mesh;
    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;

    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    _capSegments = _capSegments+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    int capSegs = _capSegments;
    if ( capSegs < 2 )
        capSegs = 0;

    float angleIncRadius = -1.f * ((TAU/((float)_radiusSegments-1.f)));
    float heightInc = _height/((float)_heightSegments-1);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 tcoord;
    glm::vec3 up(0.0,1.0,0.0);

    std::size_t vertOffset = 0;

    float maxTexY = _heightSegments-1.f;
    if (capSegs > 0) 
        maxTexY += capSegs-1.f;

    glm::vec3 startVec(0, -halfH-1.f, 0);

    // cone vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {

            newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.y = heightInc*((float)iy) - halfH;
            vert.z = sin((float)ix*angleIncRadius) * newRad;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - (float)iy/((float)maxTexY);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );

            if (iy == 0) {
                newRad = 1.f;
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.y = heightInc*((float)iy) - halfH;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
            }

            glm::vec3 diff = vert - startVec;
            glm::vec3 crossed = glm::cross(up, vert);
            normal = glm::cross(crossed, diff);
            mesh.addNormal( glm::normalize(normal) );

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                if (y > 0){
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x );
                    mesh.addIndex( (y)*_radiusSegments + x+1 );
                    mesh.addIndex( (y+1)*_radiusSegments + x );
                }

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }
    else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();
    float maxTexYNormalized = (_heightSegments-1.f) / maxTexY;

    // add the cap //
    normal = glm::vec3(0.f, 1.f, 0.f);
    for (int iy = 0; iy < capSegs; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {
            newRad = remap((float)iy, 0, capSegs-1, radius, 0.0, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.z = sin((float)ix*angleIncRadius) * newRad;
            vert.y = halfH;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - remap(iy, 0, capSegs-1, maxTexYNormalized, 1.f, true);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );
        }
    }

    if (_drawMode == TRIANGLES) {
        if ( capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {

                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs-2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        }
    }
    else {
        if (capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }
    }

    return mesh;
}